

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::OP_NewScIntArray(InterpreterStackFrame *this,OpLayoutAuxiliary *playout)

{
  AuxArray<int> *ints;
  JavascriptArray *this_00;
  
  ints = ByteCodeReader::ReadAuxArray<int>
                   ((playout->super_OpLayoutAuxNoReg).Offset,*(FunctionBody **)(this + 0x88));
  this_00 = (JavascriptArray *)
            JavascriptLibrary::CreateNativeIntArrayLiteral
                      (*(JavascriptLibrary **)(*(long *)(this + 0x78) + 8),ints->count);
  JavascriptOperators::AddIntsToArraySegment((SparseArraySegment<int> *)(this_00->head).ptr,ints);
  JavascriptArray::CheckForceES5Array(this_00);
  SetReg<unsigned_int>(this,playout->R0,this_00);
  return;
}

Assistant:

void InterpreterStackFrame::OP_NewScIntArray(const unaligned OpLayoutAuxiliary * playout)
    {
        const Js::AuxArray<int32> *ints = Js::ByteCodeReader::ReadAuxArray<int32>(playout->Offset, this->GetFunctionBody());

        JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(ints->count);

        SparseArraySegment<int32> * segment = (SparseArraySegment<int32>*)arr->GetHead();

        JavascriptOperators::AddIntsToArraySegment(segment, ints);

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        arr->CheckForceES5Array();
#endif

        SetReg(playout->R0, arr);
    }